

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::register_application_link_hash
          (Impl *this,ResourceTag tag,Hash hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  bool bVar1;
  pointer puVar2;
  int iVar3;
  Hash hash_00;
  byte bVar4;
  
  if (this->application_feature_links == true) {
    bVar1 = this->checksum;
    hash_00 = get_application_link_hash(this,tag,hash);
    register_on_use(this,RESOURCE_APPLICATION_BLOB_LINK,hash_00);
    iVar3 = (*this->database_iface->_vptr_DatabaseInterface[5])(this->database_iface,8,hash_00);
    if ((byte)iVar3 == 0) {
      serialize_application_blob_link(this,hash,tag,blob);
      puVar2 = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (*this->database_iface->_vptr_DatabaseInterface[4])
                (this->database_iface,8,hash_00,puVar2,
                 (long)(blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar2,(ulong)bVar1 << 3);
    }
    bVar4 = (byte)iVar3 ^ 1;
  }
  else {
    bVar4 = 0;
  }
  return (bool)bVar4;
}

Assistant:

bool StateRecorder::Impl::register_application_link_hash(ResourceTag tag, Hash hash, vector<uint8_t> &blob) const
{
	if (!application_feature_links)
		return false;

	PayloadWriteFlags payload_flags = 0;
	if (checksum)
		payload_flags |= PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT;

	Hash link_hash = get_application_link_hash(tag, hash);
	register_on_use(RESOURCE_APPLICATION_BLOB_LINK, link_hash);
	if (!database_iface->has_entry(RESOURCE_APPLICATION_BLOB_LINK, link_hash))
	{
		if (!serialize_application_blob_link(hash, tag, blob))
			return false;
		database_iface->write_entry(RESOURCE_APPLICATION_BLOB_LINK, link_hash, blob.data(), blob.size(), payload_flags);
		return true;
	}
	else
		return false;
}